

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::quantize(FastText *this,Args *qargs,TrainCallback *callback)

{
  uint uVar1;
  element_type *peVar2;
  ulong uVar3;
  invalid_argument *this_00;
  long lVar4;
  long lVar5;
  ulong uVar6;
  bool normalizeGradient;
  shared_ptr<fasttext::Loss> loss;
  shared_ptr<fasttext::DenseMatrix> ninput;
  shared_ptr<fasttext::DenseMatrix> input;
  shared_ptr<fasttext::Loss> loss_1;
  shared_ptr<fasttext::DenseMatrix> output;
  __shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  peVar2 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2->model == sup) {
    std::__cxx11::string::_M_assign((string *)&peVar2->input);
    peVar2 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar2->qout = qargs->qout;
    std::__cxx11::string::_M_assign((string *)&peVar2->output);
    std::dynamic_pointer_cast<fasttext::DenseMatrix,fasttext::Matrix>
              ((shared_ptr<fasttext::Matrix> *)&input);
    std::dynamic_pointer_cast<fasttext::DenseMatrix,fasttext::Matrix>
              ((shared_ptr<fasttext::Matrix> *)&output);
    uVar6 = qargs->cutoff;
    if (uVar6 != 0) {
      uVar3 = Matrix::size(&(input.
                             super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->super_Matrix,0);
      if (uVar6 < uVar3) {
        selectEmbeddings((vector<int,_std::allocator<int>_> *)&loss,this,(int32_t)qargs->cutoff);
        Dictionary::prune((this->dict_).
                          super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,(vector<int,_std::allocator<int>_> *)&loss);
        loss_1.super___shared_ptr<fasttext::Loss,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             ((long)loss.super___shared_ptr<fasttext::Loss,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi -
              (long)loss.super___shared_ptr<fasttext::Loss,_(__gnu_cxx::_Lock_policy)2>._M_ptr >> 2)
        ;
        std::make_shared<fasttext::DenseMatrix,unsigned_long,int&>
                  ((unsigned_long *)&ninput,(int *)&loss_1);
        peVar2 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        lVar4 = 0;
        for (lVar5 = 0;
            lVar5 != (long)loss.super___shared_ptr<fasttext::Loss,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi -
                     (long)loss.super___shared_ptr<fasttext::Loss,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr >> 2; lVar5 = lVar5 + 1) {
          uVar1 = peVar2->dim;
          for (uVar6 = 0; (~((int)uVar1 >> 0x1f) & uVar1) != uVar6; uVar6 = uVar6 + 1) {
            *(float *)(*(long *)(CONCAT44(ninput.
                                          super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr._4_4_,
                                          ninput.
                                          super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr._0_4_) + 0x10) * lVar4 +
                       *(long *)(CONCAT44(ninput.
                                          super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr._4_4_,
                                          ninput.
                                          super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr._0_4_) + 0x18) + uVar6 * 4) =
                 ((input.super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->data_).mem_
                 [(long)*(int *)((long)&(loss.
                                         super___shared_ptr<fasttext::Loss,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->_vptr_Loss + lVar5 * 4) *
                  ((input.super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_Matrix).n_ + uVar6];
          }
          lVar4 = lVar4 + 4;
        }
        std::__shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&input.super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>,
                   &ninput.super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>);
        if (qargs->retrain != false) {
          peVar2 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          peVar2->epoch = qargs->epoch;
          peVar2->lr = qargs->lr;
          peVar2->thread = qargs->thread;
          peVar2->verbose = qargs->verbose;
          createLoss((FastText *)&loss_1,(shared_ptr<fasttext::Matrix> *)this);
          std::
          make_shared<fasttext::Model,std::shared_ptr<fasttext::DenseMatrix>&,std::shared_ptr<fasttext::DenseMatrix>&,std::shared_ptr<fasttext::Loss>&,bool&>
                    ((shared_ptr<fasttext::DenseMatrix> *)&local_40,&input,
                     (shared_ptr<fasttext::Loss> *)&output,(bool *)&loss_1);
          std::__shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>
                     ,&local_40);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
          startThreads(this,callback);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&loss_1.super___shared_ptr<fasttext::Loss,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&ninput.super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&loss);
      }
    }
    std::make_shared<fasttext::QuantMatrix,fasttext::DenseMatrix,unsigned_long_const&,bool_const&>
              ((DenseMatrix *)&loss,
               (unsigned_long *)
               input.super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (bool *)&qargs->dsub);
    std::__shared_ptr<fasttext::Matrix,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<fasttext::Matrix,(__gnu_cxx::_Lock_policy)2> *)&this->input_,
               (__shared_ptr<fasttext::QuantMatrix,_(__gnu_cxx::_Lock_policy)2> *)&loss);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&loss.super___shared_ptr<fasttext::Loss,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->qout
        == true) {
      ninput.super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 2;
      std::make_shared<fasttext::QuantMatrix,fasttext::DenseMatrix,int,bool_const&>
                ((DenseMatrix *)&loss,
                 (int *)output.super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,(bool *)&ninput);
      std::__shared_ptr<fasttext::Matrix,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<fasttext::Matrix,(__gnu_cxx::_Lock_policy)2> *)&this->output_,
                 (__shared_ptr<fasttext::QuantMatrix,_(__gnu_cxx::_Lock_policy)2> *)&loss);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&loss.super___shared_ptr<fasttext::Loss,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    this->quant_ = true;
    createLoss((FastText *)&loss,(shared_ptr<fasttext::Matrix> *)this);
    std::
    make_shared<fasttext::Model,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Loss>&,bool&>
              ((shared_ptr<fasttext::Matrix> *)&ninput,&this->input_,
               (shared_ptr<fasttext::Loss> *)&this->output_,(bool *)&loss);
    std::__shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2> *)&ninput);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ninput.super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&loss.super___shared_ptr<fasttext::Loss,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&output.super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&input.super___shared_ptr<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_00,"For now we only support quantization of supervised models");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void FastText::quantize(const Args& qargs, const TrainCallback& callback) {
  if (args_->model != model_name::sup) {
    throw std::invalid_argument(
        "For now we only support quantization of supervised models");
  }
  args_->input = qargs.input;
  args_->qout = qargs.qout;
  args_->output = qargs.output;
  std::shared_ptr<DenseMatrix> input =
      std::dynamic_pointer_cast<DenseMatrix>(input_);
  std::shared_ptr<DenseMatrix> output =
      std::dynamic_pointer_cast<DenseMatrix>(output_);
  bool normalizeGradient = (args_->model == model_name::sup);

  if (qargs.cutoff > 0 && qargs.cutoff < input->size(0)) {
    auto idx = selectEmbeddings(qargs.cutoff);
    dict_->prune(idx);
    std::shared_ptr<DenseMatrix> ninput =
        std::make_shared<DenseMatrix>(idx.size(), args_->dim);
    for (auto i = 0; i < idx.size(); i++) {
      for (auto j = 0; j < args_->dim; j++) {
        ninput->at(i, j) = input->at(idx[i], j);
      }
    }
    input = ninput;
    if (qargs.retrain) {
      args_->epoch = qargs.epoch;
      args_->lr = qargs.lr;
      args_->thread = qargs.thread;
      args_->verbose = qargs.verbose;
      auto loss = createLoss(output_);
      model_ = std::make_shared<Model>(input, output, loss, normalizeGradient);
      startThreads(callback);
    }
  }
  input_ = std::make_shared<QuantMatrix>(
      std::move(*(input.get())), qargs.dsub, qargs.qnorm);

  if (args_->qout) {
    output_ = std::make_shared<QuantMatrix>(
        std::move(*(output.get())), 2, qargs.qnorm);
  }
  quant_ = true;
  auto loss = createLoss(output_);
  model_ = std::make_shared<Model>(input_, output_, loss, normalizeGradient);
}